

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O1

void __thiscall SGParser::Generator::Production::~Production(Production *this)

{
  uint *puVar1;
  pointer puVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  puVar1 = this->pRight;
  if ((puVar1 != (uint *)0x0) && (*puVar1 = *puVar1 - 1, *puVar1 == 0)) {
    operator_delete__(puVar1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
  ::~_Rb_tree(&(this->ConflictActions)._M_t);
  puVar2 = (this->LeftChain).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->LeftChain).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->ReduceOverrides)._M_t);
  pcVar3 = (this->Name)._M_dataplus._M_p;
  paVar4 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Production::~Production() {
    // Delete RHS
    if (pRight)
        if (!(--pRight[0u]))
            delete[] pRight;
}